

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_nmake.cpp
# Opt level: O0

int __thiscall NmakeMakefileGenerator::init(NmakeMakefileGenerator *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  rvalue_ref t;
  EVP_PKEY_CTX *pEVar2;
  long in_FS_OFFSET;
  ProStringList *defines;
  int secondDot;
  int firstDot;
  QString escapedPdbFile;
  QString distPdbFile;
  QString pdbfile;
  ProString targetBase;
  QFileInfo targetFileInfo;
  ProString version;
  ProString major_minor;
  QString defFileName;
  QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> *in_stack_ffffffffffffe318;
  QMakeProject *in_stack_ffffffffffffe320;
  QMakeProject *this_00;
  QMakeProject *in_stack_ffffffffffffe328;
  CaseSensitivity in_stack_ffffffffffffe330;
  int in_stack_ffffffffffffe334;
  uint uVar3;
  QMakeProject *in_stack_ffffffffffffe338;
  ProString *in_stack_ffffffffffffe340;
  bool local_1cb1;
  ProStringList *in_stack_ffffffffffffe358;
  undefined8 in_stack_ffffffffffffe3c0;
  undefined1 canon;
  QString *in_stack_ffffffffffffe3c8;
  undefined7 in_stack_ffffffffffffe3d0;
  undefined1 in_stack_ffffffffffffe3d7;
  bool local_1bc1;
  bool local_1b31;
  bool local_1b19;
  undefined4 in_stack_ffffffffffffe5e8;
  undefined1 in_stack_ffffffffffffe5ec;
  undefined1 in_stack_ffffffffffffe5ed;
  undefined1 in_stack_ffffffffffffe5ee;
  undefined1 in_stack_ffffffffffffe5ef;
  byte bVar4;
  QFlagsStorage<MakefileGenerator::FileFixifyType> in_stack_ffffffffffffe87c;
  undefined8 local_16c0;
  undefined8 local_16b8;
  undefined8 local_16b0;
  undefined1 local_1648 [48];
  undefined1 local_1618 [224];
  QStringBuilder<const_ProString_&,_const_char_(&)[5]> local_1538;
  undefined8 local_1528;
  undefined8 local_1520;
  undefined8 local_1518;
  QString local_1510 [2];
  QStringBuilder<const_ProString_&,_const_char_(&)[5]> local_14e0;
  QStringBuilder<const_ProString_&,_const_char_(&)[5]> local_1470;
  undefined1 local_1369;
  undefined1 local_1350 [576];
  undefined1 local_1110 [24];
  undefined8 local_10f8 [70];
  undefined1 local_ec8 [48];
  undefined1 local_e98 [296];
  undefined1 local_d70 [48];
  undefined1 local_d40 [840];
  undefined1 local_9f8 [48];
  undefined1 local_9c8 [296];
  undefined1 local_8a0 [48];
  undefined1 local_870 [456];
  EVP_PKEY_CTX local_6a8 [96];
  EVP_PKEY_CTX local_648 [48];
  QStringBuilder<const_char_(&)[10],_ProString_&> local_618;
  ProString local_548 [2];
  ProString local_4e8;
  undefined1 local_4b8 [320];
  undefined8 local_378;
  undefined8 local_370;
  undefined8 local_368;
  long local_8;
  
  canon = (undefined1)((ulong)in_stack_ffffffffffffe3c0 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
  QMakeEvaluator::first
            (&in_stack_ffffffffffffe338->super_QMakeEvaluator,
             (ProKey *)CONCAT44(in_stack_ffffffffffffe334,in_stack_ffffffffffffe330));
  bVar1 = ProString::operator==(in_stack_ffffffffffffe340,(char *)in_stack_ffffffffffffe338);
  ProString::~ProString((ProString *)0x25efdc);
  ProKey::~ProKey((ProKey *)0x25efe9);
  if (bVar1) {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
    QMakeProject::values(in_stack_ffffffffffffe320,(ProKey *)in_stack_ffffffffffffe318);
    ProString::ProString((ProString *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe338);
    QList<ProString>::append
              ((QList<ProString> *)in_stack_ffffffffffffe320,(rvalue_ref)in_stack_ffffffffffffe318);
    ProString::~ProString((ProString *)0x25f077);
    ProKey::~ProKey((ProKey *)0x25f084);
  }
  else {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
    QMakeEvaluator::first
              (&in_stack_ffffffffffffe338->super_QMakeEvaluator,
               (ProKey *)CONCAT44(in_stack_ffffffffffffe334,in_stack_ffffffffffffe330));
    bVar1 = ProString::operator==(in_stack_ffffffffffffe340,(char *)in_stack_ffffffffffffe338);
    ProString::~ProString((ProString *)0x25f0f9);
    ProKey::~ProKey((ProKey *)0x25f106);
    if (bVar1) {
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
      QMakeProject::values(in_stack_ffffffffffffe320,(ProKey *)in_stack_ffffffffffffe318);
      ProString::ProString((ProString *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe338)
      ;
      QList<ProString>::append
                ((QList<ProString> *)in_stack_ffffffffffffe320,(rvalue_ref)in_stack_ffffffffffffe318
                );
      ProString::~ProString((ProString *)0x25f194);
      ProKey::~ProKey((ProKey *)0x25f1a1);
    }
    else {
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
      QMakeEvaluator::first
                (&in_stack_ffffffffffffe338->super_QMakeEvaluator,
                 (ProKey *)CONCAT44(in_stack_ffffffffffffe334,in_stack_ffffffffffffe330));
      pEVar2 = (EVP_PKEY_CTX *)0x34cb02;
      bVar1 = ProString::operator==(in_stack_ffffffffffffe340,(char *)in_stack_ffffffffffffe338);
      ProString::~ProString((ProString *)0x25f216);
      ProKey::~ProKey((ProKey *)0x25f223);
      if (bVar1) {
        MakefileGenerator::init((MakefileGenerator *)this,pEVar2);
        ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
        QMakeProject::values(in_stack_ffffffffffffe320,(ProKey *)in_stack_ffffffffffffe318);
        bVar1 = QList<ProString>::isEmpty((QList<ProString> *)0x25f288);
        ProKey::~ProKey((ProKey *)0x25f29c);
        if (bVar1) {
          ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
          QMakeProject::values(in_stack_ffffffffffffe320,(ProKey *)in_stack_ffffffffffffe318);
          ProString::ProString
                    ((ProString *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe338);
          QList<ProString>::append
                    ((QList<ProString> *)in_stack_ffffffffffffe320,
                     (rvalue_ref)in_stack_ffffffffffffe318);
          ProString::~ProString((ProString *)0x25f32a);
          ProKey::~ProKey((ProKey *)0x25f337);
        }
        goto LAB_002614d3;
      }
    }
  }
  Win32MakefileGenerator::processVars
            ((Win32MakefileGenerator *)
             CONCAT17(in_stack_ffffffffffffe5ef,
                      CONCAT16(in_stack_ffffffffffffe5ee,
                               CONCAT15(in_stack_ffffffffffffe5ed,
                                        CONCAT14(in_stack_ffffffffffffe5ec,in_stack_ffffffffffffe5e8
                                                )))));
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
  QMakeProject::values(in_stack_ffffffffffffe320,(ProKey *)in_stack_ffffffffffffe318);
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
  QMakeProject::values(in_stack_ffffffffffffe320,(ProKey *)in_stack_ffffffffffffe318);
  QList<ProString>::operator+=
            ((QList<ProString> *)in_stack_ffffffffffffe320,
             (QList<ProString> *)in_stack_ffffffffffffe318);
  ProKey::~ProKey((ProKey *)0x25f3f5);
  ProKey::~ProKey((ProKey *)0x25f402);
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
  QMakeProject::values(in_stack_ffffffffffffe320,(ProKey *)in_stack_ffffffffffffe318);
  bVar1 = QList<ProString>::isEmpty((QList<ProString> *)0x25f44a);
  ProKey::~ProKey((ProKey *)0x25f460);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_378 = 0xaaaaaaaaaaaaaaaa;
    local_370 = 0xaaaaaaaaaaaaaaaa;
    local_368 = 0xaaaaaaaaaaaaaaaa;
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
    QMakeEvaluator::first
              (&in_stack_ffffffffffffe338->super_QMakeEvaluator,
               (ProKey *)CONCAT44(in_stack_ffffffffffffe334,in_stack_ffffffffffffe330));
    ProString::toQString((ProString *)in_stack_ffffffffffffe318);
    QFlags<MakefileGenerator::FileFixifyType>::QFlags
              ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_ffffffffffffe320,
               (FileFixifyType)((ulong)in_stack_ffffffffffffe318 >> 0x20));
    MakefileGenerator::fileFixify
              ((MakefileGenerator *)CONCAT17(in_stack_ffffffffffffe3d7,in_stack_ffffffffffffe3d0),
               in_stack_ffffffffffffe3c8,(FileFixifyTypes)in_stack_ffffffffffffe87c.i,(bool)canon);
    QString::~QString((QString *)0x25f540);
    ProString::~ProString((ProString *)0x25f54d);
    ProKey::~ProKey((ProKey *)0x25f55a);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
    QMakeProject::values(in_stack_ffffffffffffe320,(ProKey *)in_stack_ffffffffffffe318);
    QString::QString((QString *)in_stack_ffffffffffffe328,(char *)in_stack_ffffffffffffe358);
    (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
      _vptr_QMakeSourceFileInfo[0xc])(local_4b8,this,&local_378);
    ::operator+((QString *)in_stack_ffffffffffffe328,(QString *)in_stack_ffffffffffffe320);
    ProString::ProString<QString,QString>
              ((ProString *)CONCAT44(in_stack_ffffffffffffe334,in_stack_ffffffffffffe330),
               (QStringBuilder<QString,_QString> *)in_stack_ffffffffffffe328);
    QList<ProString>::append
              ((QList<ProString> *)in_stack_ffffffffffffe320,(rvalue_ref)in_stack_ffffffffffffe318);
    ProString::~ProString((ProString *)0x25f628);
    QStringBuilder<QString,_QString>::~QStringBuilder
              ((QStringBuilder<QString,_QString> *)in_stack_ffffffffffffe320);
    QString::~QString((QString *)0x25f642);
    QString::~QString((QString *)0x25f64f);
    ProKey::~ProKey((ProKey *)0x25f65c);
    QString::~QString((QString *)0x25f669);
  }
  memset(&local_4e8,0xaa,0x30);
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
  QMakeEvaluator::first
            (&in_stack_ffffffffffffe338->super_QMakeEvaluator,
             (ProKey *)CONCAT44(in_stack_ffffffffffffe334,in_stack_ffffffffffffe330));
  ProKey::~ProKey((ProKey *)0x25f6d5);
  bVar1 = ProString::isEmpty(&local_4e8);
  if (bVar1) {
    memset(local_548,0xaa,0x30);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
    QMakeEvaluator::first
              (&in_stack_ffffffffffffe338->super_QMakeEvaluator,
               (ProKey *)CONCAT44(in_stack_ffffffffffffe334,in_stack_ffffffffffffe330));
    ProKey::~ProKey((ProKey *)0x25f757);
    bVar1 = ProString::isEmpty(local_548);
    if (!bVar1) {
      ProString::indexOf(in_stack_ffffffffffffe340,(char *)in_stack_ffffffffffffe338,
                         in_stack_ffffffffffffe334,in_stack_ffffffffffffe330);
      ProString::indexOf(in_stack_ffffffffffffe340,(char *)in_stack_ffffffffffffe338,
                         in_stack_ffffffffffffe334,in_stack_ffffffffffffe330);
      ProString::left((ProString *)in_stack_ffffffffffffe328,
                      (int)((ulong)in_stack_ffffffffffffe320 >> 0x20));
      ProString::operator=
                ((ProString *)in_stack_ffffffffffffe320,(ProString *)in_stack_ffffffffffffe318);
      ProString::~ProString((ProString *)0x25f7f6);
    }
    ProString::~ProString((ProString *)0x25f803);
  }
  bVar1 = ProString::isEmpty(&local_4e8);
  if (!bVar1) {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
    QMakeProject::values(in_stack_ffffffffffffe320,(ProKey *)in_stack_ffffffffffffe318);
    local_618 = ::operator+((char (*) [10])in_stack_ffffffffffffe320,
                            (ProString *)in_stack_ffffffffffffe318);
    ProString::ProString<char_const(&)[10],ProString&>
              ((ProString *)CONCAT44(in_stack_ffffffffffffe334,in_stack_ffffffffffffe330),
               (QStringBuilder<const_char_(&)[10],_ProString_&> *)in_stack_ffffffffffffe328);
    QList<ProString>::append
              ((QList<ProString> *)in_stack_ffffffffffffe320,(rvalue_ref)in_stack_ffffffffffffe318);
    ProString::~ProString((ProString *)0x25f8bb);
    ProKey::~ProKey((ProKey *)0x25f8c8);
  }
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
  pEVar2 = local_648;
  bVar1 = QMakeProject::isEmpty
                    (in_stack_ffffffffffffe338,
                     (ProKey *)CONCAT44(in_stack_ffffffffffffe334,in_stack_ffffffffffffe330));
  ProKey::~ProKey((ProKey *)0x25f91c);
  if (bVar1) {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
    QMakeProject::values(in_stack_ffffffffffffe320,(ProKey *)in_stack_ffffffffffffe318);
    ProString::ProString((ProString *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe338);
    pEVar2 = local_6a8;
    QList<ProString>::append
              ((QList<ProString> *)in_stack_ffffffffffffe320,(rvalue_ref)in_stack_ffffffffffffe318);
    ProString::~ProString((ProString *)0x25f9aa);
    ProKey::~ProKey((ProKey *)0x25f9b7);
  }
  MakefileGenerator::init((MakefileGenerator *)this,pEVar2);
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
  QMakeEvaluator::first
            (&in_stack_ffffffffffffe338->super_QMakeEvaluator,
             (ProKey *)CONCAT44(in_stack_ffffffffffffe334,in_stack_ffffffffffffe330));
  ProString::toQString((ProString *)in_stack_ffffffffffffe318);
  QString::operator=((QString *)in_stack_ffffffffffffe320,(QString *)in_stack_ffffffffffffe318);
  QString::~QString((QString *)0x25fa4a);
  ProString::~ProString((ProString *)0x25fa57);
  ProKey::~ProKey((ProKey *)0x25fa64);
  bVar1 = QString::isEmpty((QString *)0x25fa78);
  bVar4 = 0;
  local_1b19 = false;
  if (!bVar1) {
    QString::QString((QString *)in_stack_ffffffffffffe328,(char *)in_stack_ffffffffffffe358);
    bVar4 = 1;
    local_1b19 = QMakeProject::isActiveConfig
                           (in_stack_ffffffffffffe328,(QString *)in_stack_ffffffffffffe320,
                            SUB81((ulong)in_stack_ffffffffffffe318 >> 0x38,0));
  }
  this->usePCH = local_1b19;
  if ((bVar4 & 1) != 0) {
    QString::~QString((QString *)0x25fb12);
  }
  bVar1 = QString::isEmpty((QString *)0x25fb26);
  bVar4 = 0;
  local_1b31 = false;
  if (!bVar1) {
    QString::QString((QString *)in_stack_ffffffffffffe328,(char *)in_stack_ffffffffffffe358);
    bVar4 = 1;
    local_1b31 = QMakeProject::isActiveConfig
                           (in_stack_ffffffffffffe328,(QString *)in_stack_ffffffffffffe320,
                            SUB81((ulong)in_stack_ffffffffffffe318 >> 0x38,0));
  }
  this->usePCHC = local_1b31;
  if ((bVar4 & 1) != 0) {
    QString::~QString((QString *)0x25fbc0);
  }
  if ((this->usePCH & 1U) != 0) {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
    (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
      _vptr_QMakeSourceFileInfo[0x16])(local_870,this,local_8a0);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
    QMakeEvaluator::first
              (&in_stack_ffffffffffffe338->super_QMakeEvaluator,
               (ProKey *)CONCAT44(in_stack_ffffffffffffe334,in_stack_ffffffffffffe330));
    ::operator+((QString *)in_stack_ffffffffffffe328,(ProString *)in_stack_ffffffffffffe320);
    ::operator+((QStringBuilder<QString,_ProString> *)in_stack_ffffffffffffe328,
                (char (*) [5])in_stack_ffffffffffffe320);
    ::operator+((QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[5]> *)
                in_stack_ffffffffffffe328,(QString *)in_stack_ffffffffffffe320);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[5]>,_QString_&>
                *)in_stack_ffffffffffffe318);
    QString::operator=((QString *)in_stack_ffffffffffffe320,(QString *)in_stack_ffffffffffffe318);
    QString::~QString((QString *)0x25fce5);
    QStringBuilder<QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[5]>,_QString_&>
    ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[5]>,_QString_&>
                       *)0x25fcf2);
    QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[5]>::~QStringBuilder
              ((QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[5]> *)0x25fcff);
    QStringBuilder<QString,_ProString>::~QStringBuilder
              ((QStringBuilder<QString,_ProString> *)in_stack_ffffffffffffe320);
    ProString::~ProString((ProString *)0x25fd19);
    ProKey::~ProKey((ProKey *)0x25fd26);
    QString::~QString((QString *)0x25fd33);
    ProKey::~ProKey((ProKey *)0x25fd40);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
    (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
      _vptr_QMakeSourceFileInfo[0x16])(local_9c8,this,local_9f8);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
    QMakeEvaluator::first
              (&in_stack_ffffffffffffe338->super_QMakeEvaluator,
               (ProKey *)CONCAT44(in_stack_ffffffffffffe334,in_stack_ffffffffffffe330));
    ::operator+((QString *)in_stack_ffffffffffffe328,(ProString *)in_stack_ffffffffffffe320);
    ::operator+((QStringBuilder<QString,_ProString> *)in_stack_ffffffffffffe328,
                (char (*) [9])in_stack_ffffffffffffe320);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[9]> *)
               in_stack_ffffffffffffe318);
    QString::operator=((QString *)in_stack_ffffffffffffe320,(QString *)in_stack_ffffffffffffe318);
    QString::~QString((QString *)0x25fe34);
    QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[9]>::~QStringBuilder
              ((QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[9]> *)0x25fe41);
    QStringBuilder<QString,_ProString>::~QStringBuilder
              ((QStringBuilder<QString,_ProString> *)in_stack_ffffffffffffe320);
    ProString::~ProString((ProString *)0x25fe5b);
    ProKey::~ProKey((ProKey *)0x25fe68);
    QString::~QString((QString *)0x25fe75);
    ProKey::~ProKey((ProKey *)0x25fe82);
    QString::QString((QString *)in_stack_ffffffffffffe328,(char *)in_stack_ffffffffffffe358);
    bVar1 = QMakeProject::isActiveConfig
                      (in_stack_ffffffffffffe328,(QString *)in_stack_ffffffffffffe320,
                       SUB81((ulong)in_stack_ffffffffffffe318 >> 0x38,0));
    QString::~QString((QString *)0x25feda);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ProString::ProString
                ((ProString *)in_stack_ffffffffffffe320,(QString *)in_stack_ffffffffffffe318);
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
      QMakeProject::values(in_stack_ffffffffffffe320,(ProKey *)in_stack_ffffffffffffe318);
      QList<ProString>::operator+=
                ((QList<ProString> *)in_stack_ffffffffffffe320,(rvalue_ref)in_stack_ffffffffffffe318
                );
      ProKey::~ProKey((ProKey *)0x25ff63);
      ProString::~ProString((ProString *)0x25ff70);
    }
    ProString::ProString
              ((ProString *)in_stack_ffffffffffffe320,(QString *)in_stack_ffffffffffffe318);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
    QMakeProject::values(in_stack_ffffffffffffe320,(ProKey *)in_stack_ffffffffffffe318);
    QList<ProString>::operator+=
              ((QList<ProString> *)in_stack_ffffffffffffe320,(rvalue_ref)in_stack_ffffffffffffe318);
    ProKey::~ProKey((ProKey *)0x25ffe9);
    ProString::~ProString((ProString *)0x25fff6);
    ProString::ProString
              ((ProString *)in_stack_ffffffffffffe320,(QString *)in_stack_ffffffffffffe318);
    ProStringList::ProStringList
              ((ProStringList *)in_stack_ffffffffffffe320,(ProString *)in_stack_ffffffffffffe318);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
    QMakeProject::values(in_stack_ffffffffffffe320,(ProKey *)in_stack_ffffffffffffe318);
    ProStringList::operator=
              ((ProStringList *)in_stack_ffffffffffffe320,(ProStringList *)in_stack_ffffffffffffe318
              );
    ProKey::~ProKey((ProKey *)0x260084);
    ProStringList::~ProStringList((ProStringList *)0x260091);
    ProString::~ProString((ProString *)0x26009e);
    ProString::ProString
              ((ProString *)in_stack_ffffffffffffe320,(QString *)in_stack_ffffffffffffe318);
    ProStringList::ProStringList
              ((ProStringList *)in_stack_ffffffffffffe320,(ProString *)in_stack_ffffffffffffe318);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
    QMakeProject::values(in_stack_ffffffffffffe320,(ProKey *)in_stack_ffffffffffffe318);
    ProStringList::operator=
              ((ProStringList *)in_stack_ffffffffffffe320,(ProStringList *)in_stack_ffffffffffffe318
              );
    ProKey::~ProKey((ProKey *)0x26012c);
    ProStringList::~ProStringList((ProStringList *)0x260139);
    ProString::~ProString((ProString *)0x260146);
  }
  if ((this->usePCHC & 1U) != 0) {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
    (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
      _vptr_QMakeSourceFileInfo[0x16])(local_d40,this,local_d70);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
    QMakeEvaluator::first
              (&in_stack_ffffffffffffe338->super_QMakeEvaluator,
               (ProKey *)CONCAT44(in_stack_ffffffffffffe334,in_stack_ffffffffffffe330));
    ::operator+((QString *)in_stack_ffffffffffffe328,(ProString *)in_stack_ffffffffffffe320);
    ::operator+((QStringBuilder<QString,_ProString> *)in_stack_ffffffffffffe328,
                (char (*) [7])in_stack_ffffffffffffe320);
    ::operator+((QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[7]> *)
                in_stack_ffffffffffffe328,(QString *)in_stack_ffffffffffffe320);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[7]>,_QString_&>
                *)in_stack_ffffffffffffe318);
    QString::operator=((QString *)in_stack_ffffffffffffe320,(QString *)in_stack_ffffffffffffe318);
    QString::~QString((QString *)0x26026b);
    QStringBuilder<QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[7]>,_QString_&>
    ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[7]>,_QString_&>
                       *)0x260278);
    QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[7]>::~QStringBuilder
              ((QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[7]> *)0x260285);
    QStringBuilder<QString,_ProString>::~QStringBuilder
              ((QStringBuilder<QString,_ProString> *)in_stack_ffffffffffffe320);
    ProString::~ProString((ProString *)0x26029f);
    ProKey::~ProKey((ProKey *)0x2602ac);
    QString::~QString((QString *)0x2602b9);
    ProKey::~ProKey((ProKey *)0x2602c6);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
    (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
      _vptr_QMakeSourceFileInfo[0x16])(local_e98,this,local_ec8);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
    QMakeEvaluator::first
              (&in_stack_ffffffffffffe338->super_QMakeEvaluator,
               (ProKey *)CONCAT44(in_stack_ffffffffffffe334,in_stack_ffffffffffffe330));
    ::operator+((QString *)in_stack_ffffffffffffe328,(ProString *)in_stack_ffffffffffffe320);
    ::operator+((QStringBuilder<QString,_ProString> *)in_stack_ffffffffffffe328,
                (char (*) [11])in_stack_ffffffffffffe320);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[11]> *)
               in_stack_ffffffffffffe318);
    QString::operator=((QString *)in_stack_ffffffffffffe320,(QString *)in_stack_ffffffffffffe318);
    QString::~QString((QString *)0x2603ba);
    QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[11]>::~QStringBuilder
              ((QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[11]> *)0x2603c7);
    QStringBuilder<QString,_ProString>::~QStringBuilder
              ((QStringBuilder<QString,_ProString> *)in_stack_ffffffffffffe320);
    ProString::~ProString((ProString *)0x2603e1);
    ProKey::~ProKey((ProKey *)0x2603ee);
    QString::~QString((QString *)0x2603fb);
    ProKey::~ProKey((ProKey *)0x260408);
    QString::QString((QString *)in_stack_ffffffffffffe328,(char *)in_stack_ffffffffffffe358);
    bVar1 = QMakeProject::isActiveConfig
                      (in_stack_ffffffffffffe328,(QString *)in_stack_ffffffffffffe320,
                       SUB81((ulong)in_stack_ffffffffffffe318 >> 0x38,0));
    QString::~QString((QString *)0x260460);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ProString::ProString
                ((ProString *)in_stack_ffffffffffffe320,(QString *)in_stack_ffffffffffffe318);
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
      QMakeProject::values(in_stack_ffffffffffffe320,(ProKey *)in_stack_ffffffffffffe318);
      QList<ProString>::operator+=
                ((QList<ProString> *)in_stack_ffffffffffffe320,(rvalue_ref)in_stack_ffffffffffffe318
                );
      ProKey::~ProKey((ProKey *)0x2604e9);
      ProString::~ProString((ProString *)0x2604f6);
    }
    ProString::ProString
              ((ProString *)in_stack_ffffffffffffe320,(QString *)in_stack_ffffffffffffe318);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
    QMakeProject::values(in_stack_ffffffffffffe320,(ProKey *)in_stack_ffffffffffffe318);
    QList<ProString>::operator+=
              ((QList<ProString> *)in_stack_ffffffffffffe320,(rvalue_ref)in_stack_ffffffffffffe318);
    ProKey::~ProKey((ProKey *)0x26056f);
    ProString::~ProString((ProString *)0x26057c);
    ProString::ProString
              ((ProString *)in_stack_ffffffffffffe320,(QString *)in_stack_ffffffffffffe318);
    ProStringList::ProStringList
              ((ProStringList *)in_stack_ffffffffffffe320,(ProString *)in_stack_ffffffffffffe318);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
    QMakeProject::values(in_stack_ffffffffffffe320,(ProKey *)in_stack_ffffffffffffe318);
    ProStringList::operator=
              ((ProStringList *)in_stack_ffffffffffffe320,(ProStringList *)in_stack_ffffffffffffe318
              );
    ProKey::~ProKey((ProKey *)0x26060a);
    ProStringList::~ProStringList((ProStringList *)0x260617);
    ProString::~ProString((ProString *)0x260624);
    ProString::ProString
              ((ProString *)in_stack_ffffffffffffe320,(QString *)in_stack_ffffffffffffe318);
    ProStringList::ProStringList
              ((ProStringList *)in_stack_ffffffffffffe320,(ProString *)in_stack_ffffffffffffe318);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
    QMakeProject::values(in_stack_ffffffffffffe320,(ProKey *)in_stack_ffffffffffffe318);
    ProStringList::operator=
              ((ProStringList *)in_stack_ffffffffffffe320,(ProStringList *)in_stack_ffffffffffffe318
              );
    ProKey::~ProKey((ProKey *)0x2606b2);
    ProStringList::~ProStringList((ProStringList *)0x2606bf);
    ProString::~ProString((ProString *)0x2606cc);
  }
  local_10f8[0] = 0xaaaaaaaaaaaaaaaa;
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
  QMakeEvaluator::first
            (&in_stack_ffffffffffffe338->super_QMakeEvaluator,
             (ProKey *)CONCAT44(in_stack_ffffffffffffe334,in_stack_ffffffffffffe330));
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
  QMakeEvaluator::first
            (&in_stack_ffffffffffffe338->super_QMakeEvaluator,
             (ProKey *)CONCAT44(in_stack_ffffffffffffe334,in_stack_ffffffffffffe330));
  ::operator+((ProString *)in_stack_ffffffffffffe328,(ProString *)in_stack_ffffffffffffe320);
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
  QMakeEvaluator::first
            (&in_stack_ffffffffffffe338->super_QMakeEvaluator,
             (ProKey *)CONCAT44(in_stack_ffffffffffffe334,in_stack_ffffffffffffe330));
  ::operator+((QStringBuilder<ProString,_ProString> *)in_stack_ffffffffffffe328,
              (ProString *)in_stack_ffffffffffffe320);
  ::QStringBuilder::operator_cast_to_QString(in_stack_ffffffffffffe318);
  QFileInfo::QFileInfo((QFileInfo *)local_10f8,(QString *)local_1110);
  QString::~QString((QString *)0x260824);
  QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>::~QStringBuilder
            ((QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> *)
             in_stack_ffffffffffffe320);
  ProString::~ProString((ProString *)0x26083e);
  ProKey::~ProKey((ProKey *)0x26084b);
  QStringBuilder<ProString,_ProString>::~QStringBuilder
            ((QStringBuilder<ProString,_ProString> *)in_stack_ffffffffffffe320);
  ProString::~ProString((ProString *)0x260865);
  ProKey::~ProKey((ProKey *)0x260872);
  ProString::~ProString((ProString *)0x26087f);
  ProKey::~ProKey((ProKey *)0x26088c);
  memset(local_1350,0xaa,0x30);
  QFileInfo::path();
  local_1369 = 0x2f;
  ::operator+((QString *)in_stack_ffffffffffffe328,(char *)in_stack_ffffffffffffe320);
  QFileInfo::completeBaseName();
  ::operator+((QStringBuilder<QString,_char> *)in_stack_ffffffffffffe328,
              (QString *)in_stack_ffffffffffffe320);
  ProString::ProString<QStringBuilder<QString,char>,QString>
            ((ProString *)CONCAT44(in_stack_ffffffffffffe334,in_stack_ffffffffffffe330),
             (QStringBuilder<QStringBuilder<QString,_char>,_QString> *)in_stack_ffffffffffffe328);
  QStringBuilder<QStringBuilder<QString,_char>,_QString>::~QStringBuilder
            ((QStringBuilder<QStringBuilder<QString,_char>,_QString> *)in_stack_ffffffffffffe320);
  QString::~QString((QString *)0x26093e);
  QStringBuilder<QString,_char>::~QStringBuilder((QStringBuilder<QString,_char> *)0x26094b);
  QString::~QString((QString *)0x260958);
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
  QMakeEvaluator::first
            (&in_stack_ffffffffffffe338->super_QMakeEvaluator,
             (ProKey *)CONCAT44(in_stack_ffffffffffffe334,in_stack_ffffffffffffe330));
  bVar1 = ProString::operator==(in_stack_ffffffffffffe340,(char *)in_stack_ffffffffffffe338);
  bVar4 = 0;
  local_1bc1 = false;
  if (bVar1) {
    QString::QString((QString *)in_stack_ffffffffffffe328,(char *)in_stack_ffffffffffffe358);
    bVar4 = 1;
    local_1bc1 = QMakeProject::isActiveConfig
                           (in_stack_ffffffffffffe328,(QString *)in_stack_ffffffffffffe320,
                            SUB81((ulong)in_stack_ffffffffffffe318 >> 0x38,0));
  }
  if ((bVar4 & 1) != 0) {
    QString::~QString((QString *)0x260a46);
  }
  ProString::~ProString((ProString *)0x260a53);
  ProKey::~ProKey((ProKey *)0x260a60);
  if (local_1bc1 != false) {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
    QMakeProject::values(in_stack_ffffffffffffe320,(ProKey *)in_stack_ffffffffffffe318);
    local_1470 = ::operator+((ProString *)in_stack_ffffffffffffe320,
                             (char (*) [5])in_stack_ffffffffffffe318);
    ProString::ProString<ProString_const&,char_const(&)[5]>
              ((ProString *)CONCAT44(in_stack_ffffffffffffe334,in_stack_ffffffffffffe330),
               (QStringBuilder<const_ProString_&,_const_char_(&)[5]> *)in_stack_ffffffffffffe328);
    QList<ProString>::append
              ((QList<ProString> *)in_stack_ffffffffffffe320,(rvalue_ref)in_stack_ffffffffffffe318);
    ProString::~ProString((ProString *)0x260b13);
    ProKey::~ProKey((ProKey *)0x260b20);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
    QMakeProject::values(in_stack_ffffffffffffe320,(ProKey *)in_stack_ffffffffffffe318);
    local_14e0 = ::operator+((ProString *)in_stack_ffffffffffffe320,
                             (char (*) [5])in_stack_ffffffffffffe318);
    ProString::ProString<ProString_const&,char_const(&)[5]>
              ((ProString *)CONCAT44(in_stack_ffffffffffffe334,in_stack_ffffffffffffe330),
               (QStringBuilder<const_ProString_&,_const_char_(&)[5]> *)in_stack_ffffffffffffe328);
    QList<ProString>::append
              ((QList<ProString> *)in_stack_ffffffffffffe320,(rvalue_ref)in_stack_ffffffffffffe318);
    ProString::~ProString((ProString *)0x260bc3);
    ProKey::~ProKey((ProKey *)0x260bd0);
  }
  QString::QString((QString *)in_stack_ffffffffffffe328,(char *)in_stack_ffffffffffffe358);
  bVar1 = QMakeProject::isActiveConfig
                    (in_stack_ffffffffffffe328,(QString *)in_stack_ffffffffffffe320,
                     SUB81((ulong)in_stack_ffffffffffffe318 >> 0x38,0));
  QString::~QString((QString *)0x260c26);
  if (bVar1) {
    local_1510[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_1510[0].d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_1510[0].d.size = -0x5555555555555556;
    QString::QString((QString *)0x260c70);
    local_1528 = 0xaaaaaaaaaaaaaaaa;
    local_1520 = 0xaaaaaaaaaaaaaaaa;
    local_1518 = 0xaaaaaaaaaaaaaaaa;
    local_1538 = ::operator+((ProString *)in_stack_ffffffffffffe320,
                             (char (*) [5])in_stack_ffffffffffffe318);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<const_ProString_&,_const_char_(&)[5]> *)in_stack_ffffffffffffe318);
    QString::QString((QString *)in_stack_ffffffffffffe328,(char *)in_stack_ffffffffffffe358);
    bVar4 = QMakeProject::isActiveConfig
                      (in_stack_ffffffffffffe328,(QString *)in_stack_ffffffffffffe320,
                       SUB81((ulong)in_stack_ffffffffffffe318 >> 0x38,0));
    QString::~QString((QString *)0x260d2c);
    if ((bVar4 & 1) == 0) {
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
      (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
        _vptr_QMakeSourceFileInfo[0x16])(local_1618,this,local_1648);
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
      QMakeEvaluator::first
                (&in_stack_ffffffffffffe338->super_QMakeEvaluator,
                 (ProKey *)CONCAT44(in_stack_ffffffffffffe334,in_stack_ffffffffffffe330));
      ::operator+((QString *)in_stack_ffffffffffffe328,(ProString *)in_stack_ffffffffffffe320);
      ::operator+((QStringBuilder<QString,_ProString> *)in_stack_ffffffffffffe328,
                  (char (*) [8])in_stack_ffffffffffffe320);
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[8]> *)
                 in_stack_ffffffffffffe318);
      QString::operator=((QString *)in_stack_ffffffffffffe320,(QString *)in_stack_ffffffffffffe318);
      QString::~QString((QString *)0x260e40);
      QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[8]>::~QStringBuilder
                ((QStringBuilder<QStringBuilder<QString,_ProString>,_const_char_(&)[8]> *)0x260e4d);
      QStringBuilder<QString,_ProString>::~QStringBuilder
                ((QStringBuilder<QString,_ProString> *)in_stack_ffffffffffffe320);
      ProString::~ProString((ProString *)0x260e67);
      ProKey::~ProKey((ProKey *)0x260e74);
      QString::~QString((QString *)0x260e81);
      ProKey::~ProKey((ProKey *)0x260e8e);
    }
    else {
      QString::operator=(local_1510,(QString *)&local_1528);
    }
    local_16c0 = 0xaaaaaaaaaaaaaaaa;
    local_16b8 = 0xaaaaaaaaaaaaaaaa;
    local_16b0 = 0xaaaaaaaaaaaaaaaa;
    (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
      _vptr_QMakeSourceFileInfo[0xc])(&local_16c0,this,local_1510);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
    QMakeProject::values(in_stack_ffffffffffffe320,(ProKey *)in_stack_ffffffffffffe318);
    ::operator+((char (*) [4])in_stack_ffffffffffffe320,(QString *)in_stack_ffffffffffffe318);
    ProString::ProString<char_const(&)[4],QString&>
              ((ProString *)CONCAT44(in_stack_ffffffffffffe334,in_stack_ffffffffffffe330),
               (QStringBuilder<const_char_(&)[4],_QString_&> *)in_stack_ffffffffffffe328);
    QList<ProString>::append
              ((QList<ProString> *)in_stack_ffffffffffffe320,(rvalue_ref)in_stack_ffffffffffffe318);
    ProString::~ProString((ProString *)0x260f70);
    ProKey::~ProKey((ProKey *)0x260f7d);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
    QMakeProject::values(in_stack_ffffffffffffe320,(ProKey *)in_stack_ffffffffffffe318);
    ::operator+((char (*) [4])in_stack_ffffffffffffe320,(QString *)in_stack_ffffffffffffe318);
    ProString::ProString<char_const(&)[4],QString&>
              ((ProString *)CONCAT44(in_stack_ffffffffffffe334,in_stack_ffffffffffffe330),
               (QStringBuilder<const_char_(&)[4],_QString_&> *)in_stack_ffffffffffffe328);
    QList<ProString>::append
              ((QList<ProString> *)in_stack_ffffffffffffe320,(rvalue_ref)in_stack_ffffffffffffe318);
    ProString::~ProString((ProString *)0x26101a);
    ProKey::~ProKey((ProKey *)0x261027);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
    QMakeProject::values(in_stack_ffffffffffffe320,(ProKey *)in_stack_ffffffffffffe318);
    ProString::ProString
              ((ProString *)in_stack_ffffffffffffe320,(QString *)in_stack_ffffffffffffe318);
    QList<ProString>::append
              ((QList<ProString> *)in_stack_ffffffffffffe320,(rvalue_ref)in_stack_ffffffffffffe318);
    ProString::~ProString((ProString *)0x2610a6);
    ProKey::~ProKey((ProKey *)0x2610b3);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
    QMakeProject::values(in_stack_ffffffffffffe320,(ProKey *)in_stack_ffffffffffffe318);
    ProString::ProString
              ((ProString *)in_stack_ffffffffffffe320,(QString *)in_stack_ffffffffffffe318);
    QList<ProString>::append
              ((QList<ProString> *)in_stack_ffffffffffffe320,(rvalue_ref)in_stack_ffffffffffffe318);
    ProString::~ProString((ProString *)0x261132);
    ProKey::~ProKey((ProKey *)0x26113f);
    QString::~QString((QString *)0x26114c);
    QString::~QString((QString *)0x261159);
    QString::~QString((QString *)0x261166);
  }
  QString::QString((QString *)in_stack_ffffffffffffe328,(char *)in_stack_ffffffffffffe358);
  bVar1 = QMakeProject::isActiveConfig
                    (in_stack_ffffffffffffe328,(QString *)in_stack_ffffffffffffe320,
                     SUB81((ulong)in_stack_ffffffffffffe318 >> 0x38,0));
  QString::~QString((QString *)0x2611b3);
  if (bVar1) {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
    in_stack_ffffffffffffe358 =
         QMakeProject::values(in_stack_ffffffffffffe320,(ProKey *)in_stack_ffffffffffffe318);
    ::operator+((ProString *)in_stack_ffffffffffffe320,(char (*) [5])in_stack_ffffffffffffe318);
    ProString::ProString<ProString_const&,char_const(&)[5]>
              ((ProString *)CONCAT44(in_stack_ffffffffffffe334,in_stack_ffffffffffffe330),
               (QStringBuilder<const_ProString_&,_const_char_(&)[5]> *)in_stack_ffffffffffffe328);
    QList<ProString>::append
              ((QList<ProString> *)in_stack_ffffffffffffe320,(rvalue_ref)in_stack_ffffffffffffe318);
    ProString::~ProString((ProString *)0x261257);
    ProKey::~ProKey((ProKey *)0x261264);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
    QMakeProject::values(in_stack_ffffffffffffe320,(ProKey *)in_stack_ffffffffffffe318);
    ::operator+((ProString *)in_stack_ffffffffffffe320,(char (*) [5])in_stack_ffffffffffffe318);
    ProString::ProString<ProString_const&,char_const(&)[5]>
              ((ProString *)CONCAT44(in_stack_ffffffffffffe334,in_stack_ffffffffffffe330),
               (QStringBuilder<const_ProString_&,_const_char_(&)[5]> *)in_stack_ffffffffffffe328);
    QList<ProString>::append
              ((QList<ProString> *)in_stack_ffffffffffffe320,(rvalue_ref)in_stack_ffffffffffffe318);
    ProString::~ProString((ProString *)0x2612fb);
    ProKey::~ProKey((ProKey *)0x261308);
  }
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffe320,(char *)in_stack_ffffffffffffe318);
  QMakeProject::values(in_stack_ffffffffffffe320,(ProKey *)in_stack_ffffffffffffe318);
  bVar1 = QList<ProString>::isEmpty((QList<ProString> *)0x26134a);
  bVar4 = 0;
  local_1cb1 = false;
  if (bVar1) {
    in_stack_ffffffffffffe338 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project
    ;
    QString::QString((QString *)in_stack_ffffffffffffe328,(char *)in_stack_ffffffffffffe358);
    bVar4 = 1;
    local_1cb1 = QMakeProject::isActiveConfig
                           (in_stack_ffffffffffffe328,(QString *)in_stack_ffffffffffffe320,
                            SUB81((ulong)in_stack_ffffffffffffe318 >> 0x38,0));
  }
  uVar3 = CONCAT13(local_1cb1,(int3)in_stack_ffffffffffffe334);
  if ((bVar4 & 1) != 0) {
    QString::~QString((QString *)0x2613ca);
  }
  ProKey::~ProKey((ProKey *)0x2613d7);
  if ((uVar3 & 0x1000000) != 0) {
    this_00 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)this_00,(char *)in_stack_ffffffffffffe318);
    t = (rvalue_ref)QMakeProject::values(this_00,(ProKey *)in_stack_ffffffffffffe318);
    ProKey::~ProKey((ProKey *)0x261442);
    bVar1 = ProStringList::contains
                      ((ProStringList *)in_stack_ffffffffffffe338,
                       (char *)CONCAT44(uVar3,in_stack_ffffffffffffe330),
                       (CaseSensitivity)((ulong)t >> 0x20));
    if (!bVar1) {
      ProString::ProString((ProString *)this_00,(char *)in_stack_ffffffffffffe338);
      QList<ProString>::append((QList<ProString> *)this_00,t);
      ProString::~ProString((ProString *)0x2614aa);
    }
  }
  ProString::~ProString((ProString *)0x2614b9);
  QFileInfo::~QFileInfo((QFileInfo *)local_10f8);
  ProString::~ProString((ProString *)0x2614d3);
LAB_002614d3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void NmakeMakefileGenerator::init()
{
    /* this should probably not be here, but I'm using it to wrap the .t files */
    if(project->first("TEMPLATE") == "app")
        project->values("QMAKE_APP_FLAG").append("1");
    else if(project->first("TEMPLATE") == "lib")
        project->values("QMAKE_LIB_FLAG").append("1");
    else if(project->first("TEMPLATE") == "subdirs") {
        MakefileGenerator::init();
        if(project->values("MAKEFILE").isEmpty())
            project->values("MAKEFILE").append("Makefile");
        return;
    }

    processVars();

    project->values("LIBS") += project->values("RES_FILE");

    if (!project->values("DEF_FILE").isEmpty()) {
        QString defFileName = fileFixify(project->first("DEF_FILE").toQString());
        project->values("QMAKE_LFLAGS").append(QString("/DEF:") + escapeFilePath(defFileName));
    }

    // set /VERSION for EXE/DLL header
    ProString major_minor = project->first("VERSION_PE_HEADER");
    if (major_minor.isEmpty()) {
        ProString version = project->first("VERSION");
        if (!version.isEmpty()) {
            int firstDot = version.indexOf(".");
            int secondDot = version.indexOf(".", firstDot + 1);
            major_minor = version.left(secondDot);
        }
    }
    if (!major_minor.isEmpty())
        project->values("QMAKE_LFLAGS").append("/VERSION:" + major_minor);

    if (project->isEmpty("QMAKE_LINK_O_FLAG"))
        project->values("QMAKE_LINK_O_FLAG").append("/OUT:");

    // Base class init!
    MakefileGenerator::init();

    // Setup PCH variables
    precompH = project->first("PRECOMPILED_HEADER").toQString();
    usePCH = !precompH.isEmpty() && project->isActiveConfig("precompile_header");
    usePCHC = !precompH.isEmpty() && project->isActiveConfig("precompile_header_c");
    if (usePCH) {
        // Created files
        precompObj = var("PRECOMPILED_DIR") + project->first("TARGET") + "_pch" + Option::obj_ext;
        precompPch = var("PRECOMPILED_DIR") + project->first("TARGET") + "_pch.pch";
        // Add linking of precompObj (required for whole precompiled classes)
        // ### For clang_cl we currently let inline methods be generated in the normal objects,
        // since the PCH object is buggy (as of clang 8.0.0)
        if (!project->isActiveConfig("clang_cl"))
            project->values("OBJECTS") += precompObj;
        // Add pch file to cleanup
        project->values("QMAKE_CLEAN") += precompPch;
        // Return to variable pool
        project->values("PRECOMPILED_OBJECT") = ProStringList(precompObj);
        project->values("PRECOMPILED_PCH")    = ProStringList(precompPch);
    }
    if (usePCHC) {
        precompObjC = var("PRECOMPILED_DIR") + project->first("TARGET") + "_pch_c" + Option::obj_ext;
        precompPchC = var("PRECOMPILED_DIR") + project->first("TARGET") + "_pch_c.pch";
        if (!project->isActiveConfig("clang_cl"))
            project->values("OBJECTS") += precompObjC;
        project->values("QMAKE_CLEAN") += precompPchC;
        project->values("PRECOMPILED_OBJECT_C") = ProStringList(precompObjC);
        project->values("PRECOMPILED_PCH_C")    = ProStringList(precompPchC);
    }

    const QFileInfo targetFileInfo(project->first("DESTDIR") + project->first("TARGET")
            + project->first("TARGET_EXT"));
    const ProString targetBase = targetFileInfo.path() + '/' + targetFileInfo.completeBaseName();
    if (project->first("TEMPLATE") == "lib" && project->isActiveConfig("shared")) {
        project->values("QMAKE_CLEAN").append(targetBase + ".exp");
        project->values("QMAKE_DISTCLEAN").append(targetBase + ".lib");
    }
    if (project->isActiveConfig("debug_info")) {
        QString pdbfile;
        QString distPdbFile = targetBase + ".pdb";
        if (project->isActiveConfig("staticlib")) {
            // For static libraries, the compiler's pdb file and the dist pdb file are the same.
            pdbfile = distPdbFile;
        } else {
            // Use $${TARGET}.vc.pdb in the OBJECTS_DIR for the compiler and
            // $${TARGET}.pdb (the default) for the linker.
            pdbfile = var("OBJECTS_DIR") + project->first("TARGET") + ".vc.pdb";
        }
        QString escapedPdbFile = escapeFilePath(pdbfile);
        project->values("QMAKE_CFLAGS").append("/Fd" + escapedPdbFile);
        project->values("QMAKE_CXXFLAGS").append("/Fd" + escapedPdbFile);
        project->values("QMAKE_CLEAN").append(pdbfile);
        project->values("QMAKE_DISTCLEAN").append(distPdbFile);
    }
    if (project->isActiveConfig("debug")) {
        project->values("QMAKE_CLEAN").append(targetBase + ".ilk");
        project->values("QMAKE_CLEAN").append(targetBase + ".idb");
    }

    if (project->values("QMAKE_APP_FLAG").isEmpty() && project->isActiveConfig("dll")) {
        ProStringList &defines = project->values("DEFINES");
        if (!defines.contains("_WINDLL"))
            defines.append("_WINDLL");
    }
}